

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O0

double __thiscall
ted::
TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>::
ted(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
    *this,TreeIndexTouzetBaseline *t1,TreeIndexTouzetBaseline *t2)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_30;
  double distance;
  int k;
  TreeIndexTouzetBaseline *t2_local;
  TreeIndexTouzetBaseline *t1_local;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  *this_local;
  
  iVar1 = (t1->super_Constants).tree_size_ - (t2->super_Constants).tree_size_;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  distance._4_4_ = iVar1 + 1;
  (*(this->
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
    )._vptr_TEDAlgorithm[1])(this,t1,t2,(ulong)distance._4_4_);
  local_30 = extraout_XMM0_Qa;
  while( true ) {
    if (local_30 <= (double)(int)distance._4_4_) break;
    distance._4_4_ = distance._4_4_ << 1;
    (*(this->
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
      )._vptr_TEDAlgorithm[1])(this,t1,t2,(ulong)distance._4_4_);
    local_30 = extraout_XMM0_Qa_00;
  }
  return local_30;
}

Assistant:

double ted(const TreeIndex& t1, const TreeIndex& t2) {

    // `+1` due to possible 0 size difference - then increase by mutliplication
    // doesn't work.
    // NOTE: This `+1` influences BandMatrix width.
    int k = std::abs(t1.tree_size_ - t2.tree_size_) + 1;

    // TODO: When computing ted without k, the matrices are newly initialised.
    //       Maybe resizing would be more efficient - but it needs to be
    //       implemented.

    double distance = ted_k(t1, t2, k);
    while (k < distance) {
      k = k * 2;
      // std::cerr << k << std::endl;
      // td_ = BandMatrix<double>(t1.tree_size_, k);
      // td_.Matrix::fill_with(std::numeric_limits<double>::infinity());
      // fd_ = BandMatrix<double>(t1.tree_size_ + 1, k + 1);
      // fd_.Matrix::fill_with(std::numeric_limits<double>::infinity());
      distance = ted_k(t1, t2, k);
    }
    return distance;
  }